

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offsets.cpp
# Opt level: O2

bool __thiscall loader::offsets::load_offsets_at(offsets *this,istream *is,uint32_t pos)

{
  ostringstream *poVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long *plVar7;
  _func_int *p_Var8;
  _Ios_Iostate _Var9;
  long lVar10;
  crc32 checksum;
  undefined4 uStack_1c4;
  char magic [12];
  logger local_1b0;
  
  plVar7 = (long *)std::istream::seekg(is,pos,0);
  iVar2 = (int)is;
  if (((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) ||
     (plVar7 = (long *)std::istream::read((char *)is,(long)magic),
     (*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0)) {
    _Var9 = iVar2 + (int)is->_vptr_basic_istream[-3];
    goto LAB_0012eaee;
  }
  lVar3 = 0;
  do {
    lVar10 = lVar3;
    if (lVar10 + 0x10 == 0x80) goto LAB_0012eb4c;
    iVar4 = bcmp(magic,(anonymous_namespace)::known_setup_loader_versions + lVar10,0xc);
    lVar3 = lVar10 + 0x10;
  } while (iVar4 != 0);
  uVar6 = *(uint *)((anonymous_namespace)::known_setup_loader_versions + lVar10 + 0xc);
  if (uVar6 == 0) {
LAB_0012eb4c:
    poVar1 = &local_1b0.buffer;
    local_1b0.level = Warning;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Unexpected setup loader magic: ");
    _checksum = magic;
    ::detail::operator<<((ostream *)poVar1,(print_hex<char_*> *)&checksum);
    logger::~logger(&local_1b0);
    uVar6 = 0xffffffff;
  }
  checksum.crc = 0xffffffff;
  crypto::crc32::update(&checksum,magic,0xc);
  if (uVar6 < 0x5010500) {
LAB_0012ec05:
    crypto::checksum_base<crypto::crc32>::load<unsigned_int,util::little_endian>
              ((checksum_base<crypto::crc32> *)&checksum,is);
    uVar5 = crypto::checksum_base<crypto::crc32>::load<unsigned_int,util::little_endian>
                      ((checksum_base<crypto::crc32> *)&checksum,is);
    this->exe_offset = uVar5;
    uVar5 = 0;
    if (uVar6 < 0x4010600) {
      uVar5 = crypto::checksum_base<crypto::crc32>::load<unsigned_int,util::little_endian>
                        ((checksum_base<crypto::crc32> *)&checksum,is);
    }
    this->exe_compressed_size = uVar5;
    uVar5 = crypto::checksum_base<crypto::crc32>::load<unsigned_int,util::little_endian>
                      ((checksum_base<crypto::crc32> *)&checksum,is);
    this->exe_uncompressed_size = uVar5;
    if (uVar6 < 0x4000300) {
      (this->exe_checksum).type = Adler32;
      uVar5 = crypto::checksum_base<crypto::crc32>::load<unsigned_int,util::little_endian>
                        ((checksum_base<crypto::crc32> *)&checksum,is);
      (this->exe_checksum).field_0.adler32 = uVar5;
      uVar5 = 0;
      if (uVar6 < 0x4000000) {
        uVar5 = util::load<int,util::little_endian>(is);
      }
    }
    else {
      (this->exe_checksum).type = CRC32;
      uVar5 = crypto::checksum_base<crypto::crc32>::load<unsigned_int,util::little_endian>
                        ((checksum_base<crypto::crc32> *)&checksum,is);
      (this->exe_checksum).field_0.adler32 = uVar5;
      uVar5 = 0;
    }
    this->message_offset = uVar5;
    uVar5 = crypto::checksum_base<crypto::crc32>::load<unsigned_int,util::little_endian>
                      ((checksum_base<crypto::crc32> *)&checksum,is);
    this->header_offset = uVar5;
    uVar5 = crypto::checksum_base<crypto::crc32>::load<unsigned_int,util::little_endian>
                      ((checksum_base<crypto::crc32> *)&checksum,is);
    this->data_offset = uVar5;
    p_Var8 = is->_vptr_basic_istream[-3];
    if (((&is->field_0x20)[(long)p_Var8] & 5) == 0) {
      if (uVar6 < 0x4000a00) {
        return true;
      }
      uVar6 = util::load<int,util::little_endian>(is);
      if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
        if ((uVar6 ^ checksum.crc) == 0xffffffff) {
          return true;
        }
        local_1b0.level = Warning;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.buffer);
        std::operator<<((ostream *)&local_1b0.buffer,"Setup loader checksum mismatch!");
        logger::~logger(&local_1b0);
        return true;
      }
      _Var9 = iVar2 + (int)is->_vptr_basic_istream[-3];
      goto LAB_0012eaee;
    }
  }
  else {
    uVar5 = crypto::checksum_base<crypto::crc32>::load<unsigned_int,util::little_endian>
                      ((checksum_base<crypto::crc32> *)&checksum,is);
    p_Var8 = is->_vptr_basic_istream[-3];
    if (((&is->field_0x20)[(long)p_Var8] & 5) == 0) {
      if (uVar5 != 1) {
        poVar1 = &local_1b0.buffer;
        local_1b0.level = Warning;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"Unexpected setup loader revision: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        logger::~logger(&local_1b0);
      }
      goto LAB_0012ec05;
    }
  }
  _Var9 = iVar2 + (int)p_Var8;
LAB_0012eaee:
  std::ios::clear(_Var9);
  return false;
}

Assistant:

bool offsets::load_offsets_at(std::istream & is, boost::uint32_t pos) {
	
	if(is.seekg(pos).fail()) {
		is.clear();
		debug("could not seek to loader header");
		return false;
	}
	
	char magic[12];
	if(is.read(magic, std::streamsize(sizeof(magic))).fail()) {
		is.clear();
		debug("could not read loader header magic");
		return false;
	}
	
	setup::version_constant version = 0;
	for(size_t i = 0; i < size_t(boost::size(known_setup_loader_versions)); i++) {
		BOOST_STATIC_ASSERT(sizeof(known_setup_loader_versions[i].magic) == sizeof(magic));
		if(!memcmp(magic, known_setup_loader_versions[i].magic, sizeof(magic))) {
			version = known_setup_loader_versions[i].version;
			debug("found loader header magic version " << setup::version(version));
			break;
		}
	}
	if(!version) {
		log_warning << "Unexpected setup loader magic: " << print_hex(magic);
		version = std::numeric_limits<setup::version_constant>::max();
	}
	
	crypto::crc32 checksum;
	checksum.init();
	checksum.update(magic, sizeof(magic));
	
	if(version >= INNO_VERSION(5, 1,  5)) {
		boost::uint32_t revision = checksum.load<boost::uint32_t>(is);
		if(is.fail()) {
			is.clear();
			debug("could not read loader header revision");
			return false;
		} else if(revision != 1) {
			log_warning << "Unexpected setup loader revision: " << revision;
		}
	}
	
	(void)checksum.load<boost::uint32_t>(is);
	exe_offset = checksum.load<boost::uint32_t>(is);
	
	if(version >= INNO_VERSION(4, 1, 6)) {
		exe_compressed_size = 0;
	} else {
		exe_compressed_size = checksum.load<boost::uint32_t>(is);
	}
	
	exe_uncompressed_size = checksum.load<boost::uint32_t>(is);
	
	if(version >= INNO_VERSION(4, 0, 3)) {
		exe_checksum.type = crypto::CRC32;
		exe_checksum.crc32 = checksum.load<boost::uint32_t>(is);
	} else {
		exe_checksum.type = crypto::Adler32;
		exe_checksum.adler32 = checksum.load<boost::uint32_t>(is);
	}
	
	if(version >= INNO_VERSION(4, 0, 0)) {
		message_offset = 0;
	} else {
		message_offset = util::load<boost::uint32_t>(is);
	}
	
	header_offset = checksum.load<boost::uint32_t>(is);
	data_offset = checksum.load<boost::uint32_t>(is);
	
	if(is.fail()) {
		is.clear();
		debug("could not read loader header");
		return false;
	}
	
	if(version >= INNO_VERSION(4, 0, 10)) {
		boost::uint32_t expected = util::load<boost::uint32_t>(is);
		if(is.fail()) {
			is.clear();
			debug("could not read loader header checksum");
			return false;
		}
		if(checksum.finalize() != expected) {
			log_warning << "Setup loader checksum mismatch!";
		}
	}
	
	return true;
}